

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_writer.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::ListColumnWriter::InitializeWriteState(ListColumnWriter *this,RowGroup *row_group)

{
  pointer pCVar1;
  pointer this_00;
  long in_RDX;
  unsigned_long *in_RSI;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_> in_RDI;
  templated_unique_single_t result;
  unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>_>
  *in_stack_ffffffffffffff88;
  unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
  *in_stack_ffffffffffffff90;
  RowGroup *in_stack_ffffffffffffffb8;
  undefined1 local_30 [8];
  size_type local_28;
  long local_18;
  
  local_18 = in_RDX;
  local_28 = std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ::size((vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                     *)(in_RDX + 8));
  make_uniq<duckdb::ListColumnWriterState,duckdb_parquet::RowGroup&,unsigned_long>
            (in_stack_ffffffffffffffb8,in_RSI);
  pCVar1 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
           operator->(in_stack_ffffffffffffff90);
  (*pCVar1->_vptr_ColumnWriter[2])(local_30,pCVar1,local_18);
  this_00 = unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
            ::operator->((unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
                          *)in_stack_ffffffffffffff90);
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>::
  operator=((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
             *)this_00,
            (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
             *)in_stack_ffffffffffffff88);
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
               *)0x86bed6);
  unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>::
  unique_ptr<duckdb::ListColumnWriterState,std::default_delete<std::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>>>,void>
            ((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
              *)this_00,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ListColumnWriterState,_std::default_delete<duckdb::ListColumnWriterState>,_true>
                 *)0x86beef);
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (__uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
           .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriterState> ListColumnWriter::InitializeWriteState(duckdb_parquet::RowGroup &row_group) {
	auto result = make_uniq<ListColumnWriterState>(row_group, row_group.columns.size());
	result->child_state = child_writer->InitializeWriteState(row_group);
	return std::move(result);
}